

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void dataDeviceHandleEnter
               (void *userData,wl_data_device *device,uint32_t serial,wl_surface *surface,
               wl_fixed_t x,wl_fixed_t y,wl_data_offer *offer)

{
  GLFWbool GVar1;
  char **ppcVar2;
  _GLFWofferWayland *p_Var3;
  _GLFWofferWayland *p_Var4;
  _GLFWwindow *local_40;
  _GLFWwindow *window;
  uint i;
  wl_fixed_t y_local;
  wl_fixed_t x_local;
  wl_surface *surface_local;
  uint32_t serial_local;
  wl_data_device *device_local;
  void *userData_local;
  
  if (_glfw.wl.dragOffer != (wl_data_offer *)0x0) {
    wl_data_offer_destroy(_glfw.wl.dragOffer);
    _glfw.wl.dragOffer = (wl_data_offer *)0x0;
    _glfw.wl.dragFocus = (_GLFWwindow *)0x0;
  }
  window._4_4_ = 0;
  do {
    if (_glfw.wl.offerCount <= window._4_4_) {
LAB_00133338:
      ppcVar2 = (*_glfw.wl.client.proxy_get_tag)((wl_proxy *)surface);
      if (ppcVar2 == (char **)0x18e040) {
        if (_glfw.wl.dragOffer == (wl_data_offer *)0x0) {
          wl_data_offer_accept(offer,serial,(char *)0x0);
          wl_data_offer_destroy(offer);
        }
        else {
          wl_data_offer_accept(offer,serial,"text/uri-list");
        }
      }
      return;
    }
    if (_glfw.wl.offers[window._4_4_].offer == offer) {
      local_40 = (_GLFWwindow *)0x0;
      if ((surface != (wl_surface *)0x0) &&
         (ppcVar2 = (*_glfw.wl.client.proxy_get_tag)((wl_proxy *)surface),
         ppcVar2 == (char **)0x18e040)) {
        local_40 = (_GLFWwindow *)wl_surface_get_user_data(surface);
      }
      if ((surface == (local_40->wl).surface) && (_glfw.wl.offers[window._4_4_].text_uri_list != 0))
      {
        _glfw.wl.dragOffer = offer;
        _glfw.wl.dragFocus = local_40;
        _glfw.wl.dragSerial = serial;
      }
      p_Var3 = _glfw.wl.offers + window._4_4_;
      p_Var4 = _glfw.wl.offers + (_glfw.wl.offerCount - 1);
      p_Var3->offer = p_Var4->offer;
      GVar1 = p_Var4->text_uri_list;
      p_Var3->text_plain_utf8 = p_Var4->text_plain_utf8;
      p_Var3->text_uri_list = GVar1;
      _glfw.wl.offerCount = _glfw.wl.offerCount - 1;
      goto LAB_00133338;
    }
    window._4_4_ = window._4_4_ + 1;
  } while( true );
}

Assistant:

static void dataDeviceHandleEnter(void* userData,
                                  struct wl_data_device* device,
                                  uint32_t serial,
                                  struct wl_surface* surface,
                                  wl_fixed_t x,
                                  wl_fixed_t y,
                                  struct wl_data_offer* offer)
{
    if (_glfw.wl.dragOffer)
    {
        wl_data_offer_destroy(_glfw.wl.dragOffer);
        _glfw.wl.dragOffer = NULL;
        _glfw.wl.dragFocus = NULL;
    }

    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            _GLFWwindow* window = NULL;

            if (surface)
            {
                if (wl_proxy_get_tag((struct wl_proxy*) surface) == &_glfw.wl.tag)
                    window = wl_surface_get_user_data(surface);
            }

            if (surface == window->wl.surface && _glfw.wl.offers[i].text_uri_list)
            {
                _glfw.wl.dragOffer = offer;
                _glfw.wl.dragFocus = window;
                _glfw.wl.dragSerial = serial;
            }

            _glfw.wl.offers[i] = _glfw.wl.offers[_glfw.wl.offerCount - 1];
            _glfw.wl.offerCount--;
            break;
        }
    }

    if (wl_proxy_get_tag((struct wl_proxy*) surface) != &_glfw.wl.tag)
        return;

    if (_glfw.wl.dragOffer)
        wl_data_offer_accept(offer, serial, "text/uri-list");
    else
    {
        wl_data_offer_accept(offer, serial, NULL);
        wl_data_offer_destroy(offer);
    }
}